

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classifier.hpp
# Opt level: O3

void __thiscall
sp::template_classifier::create_templates(template_classifier *this,string *g_loc,string *b_loc)

{
  container_t ret;
  undefined1 local_78 [16];
  pointer local_68;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_58;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_38;
  
  local_58.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  make_templates_((container_t *)local_78,this,g_loc);
  local_38.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (this->good_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->good_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_68;
  local_38.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (this->good_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_38.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (this->good_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (this->good_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_78._0_8_;
  (this->good_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_78._8_8_;
  local_78 = ZEXT816(0) << 0x20;
  local_68 = (pointer)0x0;
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_38);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_78);
  make_templates_((container_t *)local_78,this,b_loc);
  local_38.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (this->bad_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->bad_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_68;
  local_38.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (this->bad_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_38.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (this->bad_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (this->bad_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_78._0_8_;
  (this->bad_templates).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_78._8_8_;
  local_78 = ZEXT816(0) << 0x20;
  local_68 = (pointer)0x0;
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_38);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_78);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_58);
  return;
}

Assistant:

inline void create_templates(const std::string& g_loc, const std::string& b_loc)
	{
		container_t ret;
		good_templates = make_templates_(g_loc);
		bad_templates  = make_templates_(b_loc);
	}